

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O0

optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_> * __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void,_supermap::Key<1UL>_>
::find(SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void,_supermap::Key<1UL>_>
       *this,Key<1UL> *pattern,
      function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
      *less,function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
            *equal)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long *in_RSI;
  optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_> *in_RDI;
  KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> firstLeqElem;
  KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> middleElem;
  uint middle;
  uint lastGt;
  uint firstLeq;
  KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *in_stack_ffffffffffffff38;
  Key<1UL> *in_stack_ffffffffffffff40;
  optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_> *this_00;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff54;
  optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_> local_68;
  undefined1 local_48 [16];
  uint local_38;
  uint local_34;
  uint local_30;
  
  iVar2 = (**(code **)(*in_RSI + 8))();
  if (iVar2 == 0) {
    std::optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>::optional
              (in_RDI);
  }
  else {
    local_30 = 0;
    local_34 = (**(code **)(*in_RSI + 8))();
    while (1 < local_34 - local_30) {
      local_38 = local_30 + local_34 >> 1;
      (**(code **)(*in_RSI + 0x20))(local_48,in_RSI,local_38);
      bVar1 = std::
              function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
              ::operator()((function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
                            *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           (KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *)
                           CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                           in_stack_ffffffffffffff40);
      if (bVar1) {
LAB_00175c6d:
        local_30 = local_38;
      }
      else {
        bVar1 = std::
                function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
                ::operator()((function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
                              *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             (KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *)
                             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                             in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff54 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff54);
        if (bVar1) goto LAB_00175c6d;
        local_34 = local_38;
      }
      KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>::~KeyValue
                ((KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *)0x175cb8);
    }
    uVar4 = local_30;
    uVar3 = (**(code **)(*in_RSI + 8))();
    if (uVar4 < uVar3) {
      this_00 = &local_68;
      (**(code **)(*in_RSI + 0x20))(this_00,in_RSI,local_30);
      bVar1 = std::
              function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
              ::operator()((function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
                            *)CONCAT44(in_stack_ffffffffffffff54,uVar4),
                           (KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *)
                           CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                           (Key<1UL> *)this_00);
      if (bVar1) {
        std::optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>::
        optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_true>
                  (this_00,in_stack_ffffffffffffff38);
      }
      else {
        std::optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>::optional
                  (in_RDI);
      }
      KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>::~KeyValue
                ((KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *)0x175d59);
    }
    else {
      std::optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>::optional
                (in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }